

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::MethodDescriptorProto::_InternalParse
          (MethodDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  MethodOptions *msg;
  uint64 uVar2;
  uint uVar3;
  char cVar4;
  uint32 tag;
  char *local_48;
  uint local_3c;
  InternalMetadataWithArena *local_38;
  
  local_38 = &this->_internal_metadata_;
  uVar3 = 0;
  local_48 = ptr;
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) goto LAB_002bd982;
    local_48 = internal::ReadTag(local_48,&local_3c,0);
    if (local_48 == (char *)0x0) break;
    cVar4 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar4 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(this);
LAB_002bd919:
      local_48 = internal::InlineGreedyStringParser(s,local_48,ctx);
      goto joined_r0x002bd947;
    case 2:
      if (cVar4 == '\x12') {
        s = _internal_mutable_input_type_abi_cxx11_(this);
        goto LAB_002bd919;
      }
      break;
    case 3:
      if (cVar4 == '\x1a') {
        s = _internal_mutable_output_type_abi_cxx11_(this);
        goto LAB_002bd919;
      }
      break;
    case 4:
      if (cVar4 == '\"') {
        msg = _internal_mutable_options(this);
        local_48 = internal::ParseContext::ParseMessage<google::protobuf::MethodOptions>
                             (ctx,msg,local_48);
        goto joined_r0x002bd947;
      }
      break;
    case 5:
      if (cVar4 == '(') {
        uVar3 = uVar3 | 0x10;
        uVar2 = internal::ReadVarint(&local_48);
        this->client_streaming_ = uVar2 != 0;
        goto joined_r0x002bd947;
      }
      break;
    case 6:
      if (cVar4 == '0') {
        uVar3 = uVar3 | 0x20;
        uVar2 = internal::ReadVarint(&local_48);
        this->server_streaming_ = uVar2 != 0;
        goto joined_r0x002bd947;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      goto LAB_002bd982;
    }
    local_48 = internal::UnknownFieldParse(local_3c,local_38,local_48,ctx);
joined_r0x002bd947:
  } while (local_48 != (char *)0x0);
  local_48 = (char *)0x0;
LAB_002bd982:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
  return local_48;
}

Assistant:

const char* MethodDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.MethodDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string input_type = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_input_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.input_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string output_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_output_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.output_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool client_streaming = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_client_streaming(&has_bits);
          client_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool server_streaming = 6 [default = false];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          _Internal::set_has_server_streaming(&has_bits);
          server_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}